

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# open62541.c
# Opt level: O0

UA_StatusCode
getTypeHierarchy(UA_NodeStore *ns,UA_Node *rootRef,UA_Boolean inverse,UA_NodeId **typeHierarchy,
                size_t *typeHierarchySize)

{
  bool bVar1;
  UA_Boolean UVar2;
  UA_NodeId *pUVar3;
  UA_NodeId *new_results;
  size_t j;
  ulong uStack_88;
  UA_Boolean duplicate;
  size_t i;
  UA_NodeId hasSubtypeNodeId;
  size_t last;
  size_t idx;
  UA_Node *node;
  UA_NodeId *pUStack_48;
  UA_StatusCode retval;
  UA_NodeId *results;
  size_t results_size;
  size_t *typeHierarchySize_local;
  UA_NodeId **typeHierarchy_local;
  UA_Boolean inverse_local;
  UA_Node *rootRef_local;
  UA_NodeStore *ns_local;
  
  results = (UA_NodeId *)0x14;
  pUStack_48 = (UA_NodeId *)malloc(0x1e0);
  if (pUStack_48 == (UA_NodeId *)0x0) {
    ns_local._4_4_ = 0x80030000;
  }
  else {
    ns_local._4_4_ = UA_NodeId_copy(&rootRef->nodeId,pUStack_48);
    if (ns_local._4_4_ == 0) {
      last = 0;
      hasSubtypeNodeId.identifier.string.data = (UA_Byte *)0x0;
      UA_NODEID_NUMERIC((UA_NodeId *)&i,0,0x2d);
      node._4_4_ = 0;
      idx = (size_t)rootRef;
      do {
        for (uStack_88 = 0; uStack_88 < *(ulong *)(idx + 0x80); uStack_88 = uStack_88 + 1) {
          if (((UA_Boolean)(*(byte *)(*(long *)(idx + 0x88) + uStack_88 * 0x50 + 0x18) & 1) ==
               inverse) &&
             (UVar2 = UA_NodeId_equal((UA_NodeId *)&i,
                                      (UA_NodeId *)(*(long *)(idx + 0x88) + uStack_88 * 0x50)),
             UVar2)) {
            bVar1 = false;
            for (new_results = (UA_NodeId *)0x0;
                new_results <= hasSubtypeNodeId.identifier.string.data;
                new_results = (UA_NodeId *)((long)&new_results->namespaceIndex + 1)) {
              UVar2 = UA_NodeId_equal((UA_NodeId *)(*(long *)(idx + 0x88) + uStack_88 * 0x50 + 0x20)
                                      ,pUStack_48 + (long)new_results);
              if (UVar2) {
                bVar1 = true;
                break;
              }
            }
            if (!bVar1) {
              if (results <= (UA_NodeId *)(hasSubtypeNodeId.identifier.string.data + 1)) {
                pUVar3 = (UA_NodeId *)realloc(pUStack_48,(long)results * 0x30);
                if (pUVar3 == (UA_NodeId *)0x0) {
                  node._4_4_ = 0x80030000;
                  break;
                }
                results = (UA_NodeId *)((long)results << 1);
                pUStack_48 = pUVar3;
              }
              hasSubtypeNodeId.identifier.string.data = hasSubtypeNodeId.identifier.string.data + 1;
              node._4_4_ = UA_NodeId_copy((UA_NodeId *)
                                          (*(long *)(idx + 0x88) + uStack_88 * 0x50 + 0x20),
                                          pUStack_48 + (long)hasSubtypeNodeId.identifier.guid.data4)
              ;
              if (node._4_4_ != 0) break;
            }
          }
        }
        do {
          last = last + 1;
          if ((hasSubtypeNodeId.identifier.string.data < last) || (node._4_4_ != 0)) {
            if (node._4_4_ != 0) {
              UA_Array_delete(pUStack_48,(size_t)hasSubtypeNodeId.identifier.string.data,
                              UA_TYPES + 0x10);
              return node._4_4_;
            }
            *typeHierarchy = pUStack_48;
            *typeHierarchySize = (size_t)(hasSubtypeNodeId.identifier.string.data + 1);
            return 0;
          }
          idx = (size_t)UA_NodeStore_get(ns,pUStack_48 + last);
        } while (((UA_Node *)idx == (UA_Node *)0x0) ||
                (((UA_Node *)idx)->nodeClass != rootRef->nodeClass));
      } while( true );
    }
    free(pUStack_48);
  }
  return ns_local._4_4_;
}

Assistant:

UA_StatusCode
getTypeHierarchy(UA_NodeStore *ns, const UA_Node *rootRef, UA_Boolean inverse,
                 UA_NodeId **typeHierarchy, size_t *typeHierarchySize) {
    size_t results_size = 20; // probably too big, but saves mallocs
    UA_NodeId *results = UA_malloc(sizeof(UA_NodeId) * results_size);
    if(!results)
        return UA_STATUSCODE_BADOUTOFMEMORY;

    UA_StatusCode retval = UA_NodeId_copy(&rootRef->nodeId, &results[0]);
    if(retval != UA_STATUSCODE_GOOD) {
        UA_free(results);
        return retval;
    }

    const UA_Node *node = rootRef;
    size_t idx = 0; /* Current index (contains NodeId of node) */
    size_t last = 0; /* Index of the last element in the array */
    const UA_NodeId hasSubtypeNodeId = UA_NODEID_NUMERIC(0, UA_NS0ID_HASSUBTYPE);
    while(true) {
        for(size_t i = 0; i < node->referencesSize; ++i) {
            /* is the reference relevant? */
            if(node->references[i].isInverse != inverse ||
               !UA_NodeId_equal(&hasSubtypeNodeId, &node->references[i].referenceTypeId))
                continue;

            /* is the target already considered? (multi-inheritance) */
            UA_Boolean duplicate = false;
            for(size_t j = 0; j <= last; ++j) {
                if(UA_NodeId_equal(&node->references[i].targetId.nodeId, &results[j])) {
                    duplicate = true;
                    break;
                }
            }
            if(duplicate)
                continue;

            /* increase array length if necessary */
            if(last + 1 >= results_size) {
                                UA_NodeId *new_results =
                                    UA_realloc(results, sizeof(UA_NodeId) * results_size * 2);
                                if(!new_results) {
                                    retval = UA_STATUSCODE_BADOUTOFMEMORY;
                                    break;
                                }
                                results = new_results;
                                results_size *= 2;
            }

            /* copy new nodeid to the end of the list */
            retval = UA_NodeId_copy(&node->references[i].targetId.nodeId, &results[++last]);
            if(retval != UA_STATUSCODE_GOOD)
                break;
        }

        /* Get the next node */
    next:
        ++idx;
        if(idx > last || retval != UA_STATUSCODE_GOOD)
            break;
        node = UA_NodeStore_get(ns, &results[idx]);
        if(!node || node->nodeClass != rootRef->nodeClass)
            goto next;
    }

    if(retval != UA_STATUSCODE_GOOD) {
        UA_Array_delete(results, last, &UA_TYPES[UA_TYPES_NODEID]);
        return retval;
    }

    *typeHierarchy = results;
    *typeHierarchySize = last + 1;
    return UA_STATUSCODE_GOOD;
}